

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O1

String * axl::io::createTempFile(String *__return_storage_ptr__,StringRef *dir,StringRef *prefix)

{
  size_t sVar1;
  bool bVar2;
  int __fd;
  char *p;
  String fileName;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_88;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_68;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_48;
  
  sVar1 = dir->m_length;
  if (sVar1 == 0) {
    getTempDir();
    local_68.m_length._0_1_ = 0;
    local_68._17_8_ = 0;
    local_68.m_p = (C *)0x0;
    local_68.m_hdr._0_1_ = 0;
    local_68.m_hdr._1_7_ = 0;
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::move(&local_68,&local_48);
  }
  else {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&local_68,dir);
  }
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_88,&local_68);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_68);
  if (sVar1 == 0) {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_48);
  }
  if ((local_88.m_length == 0) || (local_88.m_p[local_88.m_length - 1] != '/')) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::insert
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_88,0xffffffffffffffff,
               0x2f,1);
  }
  if (prefix->m_length == 0) {
    p = "tmpXXXXXX";
  }
  else {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::insert
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_88,0xffffffffffffffff,
               prefix);
    p = "XXXXXX";
  }
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::insert
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_88,0xffffffffffffffff,p,
             0xffffffffffffffff);
  bVar2 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::ensureExclusive
                    ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_88);
  if (!bVar2) {
    local_88.m_p = (char *)0x0;
  }
  __fd = mkstemp(local_88.m_p);
  if (__fd == -1) {
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
             m_hdr + 1) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
             m_length + 1) = 0;
    (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
         (C *)0x0;
    (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr =
         (BufHdr *)0x0;
  }
  else {
    close(__fd);
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              (__return_storage_ptr__,
               (StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_88);
  }
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_88);
  return __return_storage_ptr__;
}

Assistant:

sl::String
createTempFile(
	const sl::StringRef& dir,
	const sl::StringRef& prefix
) {
#if (_AXL_OS_WIN)
	wchar_t buffer_w[MAX_PATH + 1];
	::GetTempFileNameW(
		!dir.isEmpty() ? dir.s2().sz() : getTempDir_w().sz(),
		prefix.s2().szn(),
		0,
		buffer_w
	);

	return buffer_w;
#else
	sl::String fileName = !dir.isEmpty() ? dir : getTempDir();
	if (!fileName.isSuffix('/'))
		fileName += '/';

	if (!prefix.isEmpty()) {
		fileName += prefix;
		fileName += "XXXXXX";
	} else {
		fileName += "tmpXXXXXX";
	}

	int fd = ::mkstemp(fileName.p());
	if (fd == -1)
		return sl::String();

	close(fd);
	return fileName;
#endif
}